

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

char * __thiscall soul::PrimitiveType::getDescription(PrimitiveType *this)

{
  PrimitiveType *this_local;
  
  switch(this->type) {
  case void_:
    this_local = (PrimitiveType *)0x4ae901;
    break;
  case float32:
    this_local = (PrimitiveType *)0x4ae996;
    break;
  case float64:
    this_local = (PrimitiveType *)0x4ae9ad;
    break;
  case fixed:
    this_local = (PrimitiveType *)anon_var_dwarf_78f7b;
    break;
  case complex32:
    this_local = (PrimitiveType *)anon_var_dwarf_78f85;
    break;
  case complex64:
    this_local = (PrimitiveType *)anon_var_dwarf_78f8f;
    break;
  case int32:
    this_local = (PrimitiveType *)0x4ae96b;
    break;
  case int64:
    this_local = (PrimitiveType *)0x4ae981;
    break;
  case bool_:
    this_local = (PrimitiveType *)0x4ae9c4;
    break;
  default:
    this_local = (PrimitiveType *)anon_var_dwarf_78fbb;
  }
  return (char *)this_local;
}

Assistant:

const char* PrimitiveType::getDescription() const
{
    switch (type)
    {
        case Primitive::void_:          return "void";
        case Primitive::float32:        return "float32";
        case Primitive::float64:        return "float64";
        case Primitive::fixed:          return "fixed";
        case Primitive::complex32:      return "complex32";
        case Primitive::complex64:      return "complex64";
        case Primitive::int32:          return "int32";
        case Primitive::int64:          return "int64";
        case Primitive::bool_:          return "bool";
        default:                        return "<unknown>";
    }
}